

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

void __thiscall
validation_chainstatemanager_tests::chainstatemanager::test_method(chainstatemanager *this)

{
  long lVar1;
  ChainstateManager *this_00;
  __uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> _Var2;
  pointer ppCVar3;
  pointer ppCVar4;
  uint256 base_blockhash;
  path leveldb_name;
  bool bVar5;
  int iVar6;
  Chainstate *pCVar7;
  Chainstate *pCVar8;
  CBlockIndex *pCVar9;
  Chainstate *pCVar10;
  CCoinsViewCache *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> line_num;
  byte bVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar14;
  CBlockIndex **ppCVar15;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *pvVar16;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  shared_ptr<const_CBlock> pblock;
  undefined4 uVar17;
  undefined4 uVar18;
  check_type cVar19;
  undefined8 in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa50;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffa58;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  CBlockIndex *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all2;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 local_308 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_300 [2];
  undefined1 local_2f0 [16];
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  pointer local_2b8;
  char *local_2b0;
  pointer local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  CBlockIndex *exp_tip;
  CBlockIndex *active_tip;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  CBlockIndex *active_tip2;
  element_type *local_100;
  shared_count local_f8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  shared_count asStack_e0 [2];
  bool local_d0;
  BlockValidationState _;
  path local_80;
  uint256 snapshot_blockhash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman._M_t.
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2d;
  file.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  _cVar19 = 0x5e3c81;
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&_,this_00);
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CONCAT71(snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._1_7_,
                _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf
                [8]) ^ 1;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  asStack_e0[1].pi_ = (sp_counted_base *)&all2;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_153cc86;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc73369;
  criticalblock19.super_unique_lock._8_8_ =
       criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_150 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&snapshot_blockhash,(lazy_ostream *)&criticalblock19,1,0,WARN,
             _cVar19,(size_t)&local_158,0x2d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  pCVar7 = ChainstateManager::ActiveChainstate(this_00);
  _.super_ValidationState<BlockValidationResult>._0_8_ = pCVar7;
  std::vector<Chainstate*,std::allocator<Chainstate*>>::emplace_back<Chainstate*>
            ((vector<Chainstate*,std::allocator<Chainstate*>> *)&chainstates,(Chainstate **)&_);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  file_00.m_end = (iterator)0x34;
  file_00.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  _cVar19 = 0x5e3d87;
  bVar5 = ChainstateManager::IsSnapshotActive(this_00);
  criticalblock19.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,!bVar5);
  criticalblock19.super_unique_lock._M_owns = false;
  criticalblock19.super_unique_lock._9_7_ = 0;
  asStack_e0[0].pi_ = (sp_counted_base *)0x0;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153cc9f;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!manager.IsSnapshotActive()" + 0x1b;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_0113a070;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_180 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)(assertion_result *)&snapshot_blockhash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&_,1,0,WARN,_cVar19,
             (size_t)&local_188,0x34);
  boost::detail::shared_count::~shared_count(asStack_e0);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  file_01.m_end = (iterator)0x35;
  file_01.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&_,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x35,false);
  bVar11 = 1;
  if (((this_00->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
     (_Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           *(tuple<Chainstate_*,_std::default_delete<Chainstate>_> *)
            &(this_00->m_ibd_chainstate)._M_t,
     (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
     _Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
     super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)) {
    bVar11 = *(byte *)((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x38) ^ 1;
  }
  _cVar19 = 0x5e3e9f;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  criticalblock19.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,bVar11);
  criticalblock19.super_unique_lock._M_owns = false;
  criticalblock19.super_unique_lock._9_7_ = 0;
  asStack_e0[0].pi_ = (sp_counted_base *)0x0;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_153ccb8;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "(MaybeCheckNotHeld(::cs_main), [&]() -> decltype(auto) { UniqueLock criticalblock14(MaybeCheckNotHeld(::cs_main), \"::cs_main\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 53); return !manager.IsSnapshotValidated(); }())"
       + 0x12e;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_0113a070;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b0 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)(assertion_result *)&snapshot_blockhash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&_,1,0,WARN,_cVar19,
             (size_t)&local_1b8,0x35);
  boost::detail::shared_count::~shared_count(asStack_e0);
  ChainstateManager::GetAll(&all,this_00);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar12;
  file_02.m_end = (iterator)0x37;
  file_02.m_begin = (iterator)&local_1e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
             msg_02);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&criticalblock19,(equal_coll_impl *)&snapshot_blockhash,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1f8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&_,1,0xd,4,0xc734b5,
             (size_t)&local_200,0x37,"all.end()","chainstates.begin()",0xc734df);
  boost::detail::shared_count::~shared_count(asStack_e0);
  pvVar12 = (iterator)0x39;
  pvVar13 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&_,&cs_main,"manager.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x39,false);
  pCVar8 = ChainstateManager::ActiveChainstate(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar13;
  msg_03.m_begin = pvVar12;
  file_03.m_end = (iterator)0x3a;
  file_03.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
             msg_03);
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&pCVar8->m_chain;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_228 = "";
  pUVar14 = &criticalblock19;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = &pCVar7->m_chain;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CChain*,CChain*>
            (&_,&local_230,0x3a,1,2,pUVar14,"&active_chain",(equal_coll_impl *)&snapshot_blockhash,
             0xc734ff);
  TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,10);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pUVar14;
  msg_04.m_begin = pvVar12;
  file_04.m_end = (iterator)0x3e;
  file_04.m_begin = (iterator)&local_240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
             msg_04);
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_258 = "";
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&cs_main,"manager.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x3e,false);
  iVar6 = ChainstateManager::ActiveHeight(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar6;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar6 >> 8);
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar6 >> 0x10);
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar6 >> 0x18);
  criticalblock19.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock19.super_unique_lock._M_device._4_4_,0x6e);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&_,&local_260,0x3e,1,2,&snapshot_blockhash,
             "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock16(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 62); return manager.ActiveHeight(); }())"
             ,&criticalblock19.super_unique_lock,0xc7364d);
  pvVar12 = (iterator)0x3f;
  pvVar13 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&_,&cs_main,"manager.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x3f,false);
  pCVar9 = ChainstateManager::ActiveTip(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  ppCVar3 = (pCVar7->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar7->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    exp_tip = (CBlockIndex *)0x0;
  }
  else {
    exp_tip = ppCVar3[-1];
  }
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar13;
  msg_05.m_begin = pvVar12;
  file_05.m_end = (iterator)0x41;
  file_05.m_begin = (iterator)&local_280;
  active_tip = pCVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_290,
             msg_05);
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_298 = "";
  pvVar12 = (iterator)0x2;
  ppCVar15 = &active_tip;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
            (&_,&local_2a0,0x41,1,2,ppCVar15,"active_tip",&exp_tip,0xc7365c);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a8 = (pointer)0xc7332e;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)ppCVar15;
  msg_06.m_begin = pvVar12;
  file_06.m_end = (iterator)0x43;
  file_06.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c0,
             msg_06);
  _cVar19 = 0x5e439f;
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&_,this_00);
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CONCAT71(snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._1_7_,
                _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf
                [8]) ^ 1;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_153cc86;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc73369;
  criticalblock19.super_unique_lock._8_8_ =
       criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_e0[1].pi_ = (sp_counted_base *)&all2;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2c8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&snapshot_blockhash,(lazy_ostream *)&criticalblock19,1,0,WARN,
             _cVar19,(size_t)&local_2d0,0x43);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(snapshot_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10));
  CBlockIndex::GetBlockHash(&snapshot_blockhash,active_tip);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&_,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x48,false);
  uVar17 = snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_4_;
  uVar18 = snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._20_4_;
  base_blockhash.super_base_blob<256U>.m_data._M_elems[8] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[9] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[10] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[1] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[1];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[2] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[2];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[3] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[3];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[4] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[4];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[5] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[5];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[6] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[6];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[7] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[7];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)uVar17;
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((uint)uVar17 >> 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((uint)uVar17 >> 0x10);
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((uint)uVar17 >> 0x18);
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = (char)uVar18;
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((uint)uVar18 >> 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((uint)uVar18 >> 0x10);
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((uint)uVar18 >> 0x18);
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
  pCVar10 = ChainstateManager::ActivateExistingSnapshot(this_00,base_blockhash);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  _.super_ValidationState<BlockValidationResult>._0_8_ = pCVar10;
  std::vector<Chainstate*,std::allocator<Chainstate*>>::emplace_back<Chainstate*>
            ((vector<Chainstate*,std::allocator<Chainstate*>> *)&chainstates,(Chainstate **)&_);
  fs::path::path((path *)&local_80,"chainstate");
  leveldb_name.super_path._M_pathname._M_string_length = in_stack_fffffffffffffa40;
  leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)pCVar7;
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)this;
  leveldb_name.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffa50;
  leveldb_name.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffa58._M_head_impl;
  Chainstate::InitCoinsDB(pCVar10,0x800000,true,false,leveldb_name);
  std::filesystem::__cxx11::path::~path(&local_80);
  pvVar12 = (iterator)0x4d;
  pvVar13 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x4d,false);
  Chainstate::InitCoinsCache(pCVar10,0x800000);
  this_01 = Chainstate::CoinsTip(pCVar10);
  CBlockIndex::GetBlockHash((uint256 *)&_,active_tip);
  CCoinsViewCache::SetBestBlock(this_01,(uint256 *)&_);
  CBlockIndex::GetBlockHash((uint256 *)&_,active_tip);
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)::node::BlockManager::LookupBlockIndex(&this_00->m_blockman,(uint256 *)&_);
  pCVar8 = pCVar10;
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              *)&pCVar10->setBlockIndexCandidates,(CBlockIndex **)&all2);
  Chainstate::LoadChainTip(pCVar10);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&_.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  _.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  _.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       & 0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&_.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  _.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  _.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d8 = "";
  line_num._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0;
  local_2f0._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar13;
  msg_07.m_begin = pvVar12;
  file_07.m_end = (iterator)0x54;
  file_07.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)line_num._M_pi,
             msg_07);
  local_308._0_4_ = 0;
  local_308[4] = '\0';
  local_308[5] = '\0';
  local_308[6] = '\0';
  local_308[7] = '\0';
  a_Stack_300[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _cVar19 = 0x5e4651;
  pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       line_num._M_pi;
  pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_308;
  bVar5 = Chainstate::ActivateBestChain(pCVar8,&_,pblock);
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar5);
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  active_tip2 = (CBlockIndex *)anon_var_dwarf_153cdd3;
  local_100 = (element_type *)0xc73684;
  criticalblock19.super_unique_lock._8_8_ =
       criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_310 = "";
  pvVar12 = &DAT_00000001;
  pvVar13 = (iterator)0x0;
  asStack_e0[1].pi_ = (sp_counted_base *)&active_tip2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&all2,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar19,
             (size_t)&local_318,0x54);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_300);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar13;
  msg_08.m_begin = pvVar12;
  file_08.m_end = (iterator)0x56;
  file_08.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_338,
             msg_08);
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_360 = "";
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&criticalblock19,this_00);
  if (local_d0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    pvVar12 = (iterator)0x2;
    pUVar14 = &criticalblock19;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&all2,&local_368,0x56,1,2,pUVar14,"manager.SnapshotBlockhash().value()",
               &snapshot_blockhash,0xc7515a);
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_370 = "";
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = (iterator)pUVar14;
    msg_09.m_begin = pvVar12;
    file_09.m_end = (iterator)0x57;
    file_09.m_begin = (iterator)&local_378;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_388,
               msg_09);
    _cVar19 = 0x5e480e;
    bVar5 = ChainstateManager::IsSnapshotActive(this_00);
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar5);
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    active_tip2 = (CBlockIndex *)0xc7336b;
    local_100 = (element_type *)0xc73385;
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_390 = "";
    pvVar12 = &DAT_00000001;
    pvVar13 = (iterator)0x0;
    asStack_e0[1].pi_ = (sp_counted_base *)&active_tip2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&all2,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar19,
               (size_t)&local_398,0x57);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_3a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3a0 = "";
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = pvVar13;
    msg_10.m_begin = pvVar12;
    file_10.m_end = &DAT_00000058;
    file_10.m_begin = (iterator)&local_3a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b8,
               msg_10);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock19,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,0x58,false);
    bVar11 = 1;
    if (((this_00->m_snapshot_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
       (_Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
             *(tuple<Chainstate_*,_std::default_delete<Chainstate>_> *)
              &(this_00->m_ibd_chainstate)._M_t,
       (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
       _Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)) {
      bVar11 = *(byte *)((long)_Var2._M_t.
                               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                               .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x38) ^ 1;
    }
    _cVar19 = 0x5e4924;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar11);
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    active_tip2 = (CBlockIndex *)anon_var_dwarf_153ce37;
    local_100 = (element_type *)0xc737d7;
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3c0 = "";
    pvVar12 = &DAT_00000001;
    pvVar13 = (iterator)0x0;
    asStack_e0[1].pi_ = (sp_counted_base *)&active_tip2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&all2,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar19,
               (size_t)&local_3c8,0x58);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3d0 = "";
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pvVar13;
    msg_11.m_begin = pvVar12;
    file_11.m_end = (iterator)0x59;
    file_11.m_begin = (iterator)&local_3d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e8,
               msg_11);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_3f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3f0 = "";
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pCVar8;
    active_tip2 = (CBlockIndex *)ChainstateManager::ActiveChainstate(this_00);
    pvVar12 = (iterator)0x2;
    pvVar16 = &all2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Chainstate*,Chainstate*>
              (&criticalblock19,&local_3f8,0x59,1,2,pvVar16,"&c2",&active_tip2,0xc737e3);
    local_408 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_400 = "";
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = (iterator)pvVar16;
    msg_12.m_begin = pvVar12;
    file_12.m_end = (iterator)0x5a;
    file_12.m_begin = (iterator)&local_408;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_418,
               msg_12);
    _cVar19 = 0x5e4acc;
    pCVar10 = ChainstateManager::ActiveChainstate(this_00);
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,pCVar7 != pCVar10);
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    active_tip2 = (CBlockIndex *)anon_var_dwarf_153ce58;
    local_100 = (element_type *)0xc737fe;
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_428 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_420 = "";
    pvVar12 = &DAT_00000001;
    pvVar13 = (iterator)0x0;
    asStack_e0[1].pi_ = (sp_counted_base *)&active_tip2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&all2,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar19,
               (size_t)&local_428,0x5a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ChainstateManager::GetAll(&all2,this_00);
    local_438 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_430 = "";
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar13;
    msg_13.m_begin = pvVar12;
    file_13.m_end = (iterator)0x5c;
    file_13.m_begin = (iterator)&local_438;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_448,
               msg_13);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)&active_tip2,(equal_coll_impl *)&local_490,
               (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                )all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                )all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_458 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_450 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&active_tip2,(lazy_ostream *)&criticalblock19,1,0xd,4,0xc737ff,
               (size_t)&local_458,0x5c,"all2.end()","chainstates.begin()",0xc734df);
    boost::detail::shared_count::~shared_count(&local_f8);
    pvVar12 = (iterator)0x5e;
    pvVar13 = (iterator)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock19,&cs_main,"manager.GetMutex()",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,0x5e,false);
    pCVar10 = ChainstateManager::ActiveChainstate(this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_460 = "";
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = pvVar13;
    msg_14.m_begin = pvVar12;
    file_14.m_end = (iterator)0x5f;
    file_14.m_begin = (iterator)&local_468;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_478,
               msg_14);
    active_tip2 = (CBlockIndex *)&pCVar10->m_chain;
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_488 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_480 = "";
    ppCVar15 = &active_tip2;
    local_490 = (CBlockIndex *)&pCVar8->m_chain;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CChain*,CChain*>
              (&criticalblock19,&local_488,0x5f,1,2,ppCVar15,"&active_chain2",
               (equal_coll_impl *)&local_490,0xc73826);
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_498 = "";
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_15.m_end = (iterator)ppCVar15;
    msg_15.m_begin = pvVar12;
    file_15.m_end = (iterator)0x61;
    file_15.m_begin = (iterator)&local_4a0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4b0,
               msg_15);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4b8 = "";
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&active_tip2,&cs_main,
               "manager.GetMutex()",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,0x61,false);
    iVar6 = ChainstateManager::ActiveHeight(this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&active_tip2);
    ppCVar15 = &local_490;
    active_tip2 = (CBlockIndex *)CONCAT44(active_tip2._4_4_,0x6e);
    pvVar12 = (iterator)0x2;
    local_490._0_4_ = iVar6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&criticalblock19,&local_4c0,0x61,1,2,ppCVar15,
               "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock22(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 97); return manager.ActiveHeight(); }())"
               ,(unique_lock<std::recursive_mutex> *)&active_tip2,0xc7364d);
    TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,1);
    local_4d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4c8 = "";
    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_16.m_end = (iterator)ppCVar15;
    msg_16.m_begin = pvVar12;
    file_16.m_end = (iterator)0x63;
    file_16.m_begin = (iterator)&local_4d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4e0,
               msg_16);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_4f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4e8 = "";
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&active_tip2,&cs_main,
               "manager.GetMutex()",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,99,false);
    iVar6 = ChainstateManager::ActiveHeight(this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&active_tip2);
    ppCVar15 = &local_490;
    active_tip2 = (CBlockIndex *)CONCAT44(active_tip2._4_4_,0x6f);
    pvVar12 = (iterator)0x2;
    local_490._0_4_ = iVar6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&criticalblock19,&local_4f0,99,1,2,ppCVar15,
               "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock23(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 99); return manager.ActiveHeight(); }())"
               ,(unique_lock<std::recursive_mutex> *)&active_tip2,0xbb25e3);
    local_500 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4f8 = "";
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_17.m_end = (iterator)ppCVar15;
    msg_17.m_begin = pvVar12;
    file_17.m_end = (iterator)0x64;
    file_17.m_begin = (iterator)&local_500;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_510,
               msg_17);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_520 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_518 = "";
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&active_tip2,&cs_main,
               "manager.GetMutex()",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,100,false);
    ppCVar3 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar4 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&active_tip2);
    local_490 = (CBlockIndex *)
                CONCAT44(local_490._4_4_,(int)((ulong)((long)ppCVar3 - (long)ppCVar4) >> 3) + -1);
    active_tip2 = (CBlockIndex *)CONCAT44(active_tip2._4_4_,0x6e);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&criticalblock19,&local_520,100,1,2,&local_490,
               "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock24(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 100); return c1.m_chain.Height(); }())"
               ,(unique_lock<std::recursive_mutex> *)&active_tip2,0xc7364d);
    pvVar12 = (iterator)0x66;
    pvVar13 = (iterator)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock19,&cs_main,"manager.GetMutex()",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,0x66,false);
    pCVar9 = ChainstateManager::ActiveTip(this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
    local_530 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_528 = "";
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_18.m_end = pvVar13;
    msg_18.m_begin = pvVar12;
    file_18.m_end = (iterator)0x67;
    file_18.m_begin = (iterator)&local_530;
    active_tip2 = pCVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_540,
               msg_18);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_548 = "";
    pvVar12 = (iterator)0x2;
    ppCVar15 = &active_tip;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (&criticalblock19,&local_550,0x67,1,2,ppCVar15,"active_tip",&pCVar9->pprev,0xc73bf6);
    local_560 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_558 = "";
    local_570 = &boost::unit_test::basic_cstring<char_const>::null;
    local_568 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_19.m_end = (iterator)ppCVar15;
    msg_19.m_begin = pvVar12;
    file_19.m_end = &DAT_00000068;
    file_19.m_begin = (iterator)&local_560;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_570,
               msg_19);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_580 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_578 = "";
    ppCVar3 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar3 ==
        (pCVar7->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_490 = (CBlockIndex *)0x0;
    }
    else {
      local_490 = ppCVar3[-1];
    }
    pvVar12 = (iterator)0x2;
    ppCVar15 = &active_tip;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (&criticalblock19,&local_580,0x68,1,2,ppCVar15,"active_tip",&local_490,0xc73c09);
    local_590 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_588 = "";
    local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_598 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_20.m_end = (iterator)ppCVar15;
    msg_20.m_begin = pvVar12;
    file_20.m_end = (iterator)0x69;
    file_20.m_begin = (iterator)&local_590;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_5a0,
               msg_20);
    criticalblock19.super_unique_lock._8_8_ =
         criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
    asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_e0[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    ppCVar3 = (pCVar8->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar3 ==
        (pCVar8->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_490 = (CBlockIndex *)0x0;
    }
    else {
      local_490 = ppCVar3[-1];
    }
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (&criticalblock19,&stack0xfffffffffffffa50,0x69,1,2,&active_tip2,"active_tip2",
               &local_490,0xc73c26);
    ValidationSignals::SyncWithValidationInterfaceQueue
              ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.validation_signals._M_t.
               super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
               _M_t.
               super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
               super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
    std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
              (&all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>);
    ValidationState<BlockValidationResult>::~ValidationState
              (&_.super_ValidationState<BlockValidationResult>);
    std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
              (&all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>);
    std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
              (&chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager, TestChain100Setup)
{
    ChainstateManager& manager = *m_node.chainman;
    std::vector<Chainstate*> chainstates;

    BOOST_CHECK(!manager.SnapshotBlockhash().has_value());

    // Create a legacy (IBD) chainstate.
    //
    Chainstate& c1 = manager.ActiveChainstate();
    chainstates.push_back(&c1);

    BOOST_CHECK(!manager.IsSnapshotActive());
    BOOST_CHECK(WITH_LOCK(::cs_main, return !manager.IsSnapshotValidated()));
    auto all = manager.GetAll();
    BOOST_CHECK_EQUAL_COLLECTIONS(all.begin(), all.end(), chainstates.begin(), chainstates.end());

    auto& active_chain = WITH_LOCK(manager.GetMutex(), return manager.ActiveChain());
    BOOST_CHECK_EQUAL(&active_chain, &c1.m_chain);

    // Get to a valid assumeutxo tip (per chainparams);
    mineBlocks(10);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 110);
    auto active_tip = WITH_LOCK(manager.GetMutex(), return manager.ActiveTip());
    auto exp_tip = c1.m_chain.Tip();
    BOOST_CHECK_EQUAL(active_tip, exp_tip);

    BOOST_CHECK(!manager.SnapshotBlockhash().has_value());

    // Create a snapshot-based chainstate.
    //
    const uint256 snapshot_blockhash = active_tip->GetBlockHash();
    Chainstate& c2 = WITH_LOCK(::cs_main, return manager.ActivateExistingSnapshot(snapshot_blockhash));
    chainstates.push_back(&c2);
    c2.InitCoinsDB(
        /*cache_size_bytes=*/1 << 23, /*in_memory=*/true, /*should_wipe=*/false);
    {
        LOCK(::cs_main);
        c2.InitCoinsCache(1 << 23);
        c2.CoinsTip().SetBestBlock(active_tip->GetBlockHash());
        c2.setBlockIndexCandidates.insert(manager.m_blockman.LookupBlockIndex(active_tip->GetBlockHash()));
        c2.LoadChainTip();
    }
    BlockValidationState _;
    BOOST_CHECK(c2.ActivateBestChain(_, nullptr));

    BOOST_CHECK_EQUAL(manager.SnapshotBlockhash().value(), snapshot_blockhash);
    BOOST_CHECK(manager.IsSnapshotActive());
    BOOST_CHECK(WITH_LOCK(::cs_main, return !manager.IsSnapshotValidated()));
    BOOST_CHECK_EQUAL(&c2, &manager.ActiveChainstate());
    BOOST_CHECK(&c1 != &manager.ActiveChainstate());
    auto all2 = manager.GetAll();
    BOOST_CHECK_EQUAL_COLLECTIONS(all2.begin(), all2.end(), chainstates.begin(), chainstates.end());

    auto& active_chain2 = WITH_LOCK(manager.GetMutex(), return manager.ActiveChain());
    BOOST_CHECK_EQUAL(&active_chain2, &c2.m_chain);

    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 110);
    mineBlocks(1);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 111);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return c1.m_chain.Height()), 110);

    auto active_tip2 = WITH_LOCK(manager.GetMutex(), return manager.ActiveTip());
    BOOST_CHECK_EQUAL(active_tip, active_tip2->pprev);
    BOOST_CHECK_EQUAL(active_tip, c1.m_chain.Tip());
    BOOST_CHECK_EQUAL(active_tip2, c2.m_chain.Tip());

    // Let scheduler events finish running to avoid accessing memory that is going to be unloaded
    m_node.validation_signals->SyncWithValidationInterfaceQueue();
}